

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

char * cmXMLParser::FindAttribute(char **atts,char *attribute)

{
  bool bVar1;
  int iVar2;
  char *unaff_RBX;
  char *__s1;
  char **ppcVar3;
  
  if (attribute != (char *)0x0 && atts != (char **)0x0) {
    __s1 = *atts;
    bVar1 = true;
    if (__s1 != (char *)0x0) {
      ppcVar3 = atts + 2;
      do {
        unaff_RBX = ppcVar3[-1];
        if (unaff_RBX == (char *)0x0) break;
        iVar2 = strcmp(__s1,attribute);
        if (iVar2 == 0) {
          bVar1 = false;
          break;
        }
        __s1 = *ppcVar3;
        ppcVar3 = ppcVar3 + 2;
      } while (__s1 != (char *)0x0);
    }
    if (!bVar1) {
      return unaff_RBX;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmXMLParser::FindAttribute(const char** atts,
                                       const char* attribute)
{
  if (atts && attribute) {
    for (const char** a = atts; *a && *(a + 1); a += 2) {
      if (strcmp(*a, attribute) == 0) {
        return *(a + 1);
      }
    }
  }
  return nullptr;
}